

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ising_model.cc
# Opt level: O0

void __thiscall lattice::print(lattice *this)

{
  const_reference pvVar1;
  vector<int,_std::allocator<int>_> *in_RDI;
  int j;
  int i;
  int local_10;
  int local_c;
  
  for (local_c = 0;
      local_c < *(int *)&in_RDI[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start; local_c = local_c + 1) {
    for (local_10 = 0;
        local_10 <
        *(int *)&in_RDI[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start; local_10 = local_10 + 1) {
      pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                         (in_RDI,(long)(local_c +
                                       local_10 *
                                       *(int *)&in_RDI[1].
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start));
      if (*pvVar1 < 0) {
        std::operator<<((ostream *)&std::cout,'.');
      }
      else {
        std::operator<<((ostream *)&std::cout,'#');
      }
    }
    std::operator<<((ostream *)&std::cout,'\n');
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void lattice::print() const {
  for (int i{0}; i < L; ++i) {
    for (int j{0}; j < L; ++j)
      if (s[i + j * L] < 0)
        std::cout << '.';
      else
        std::cout << '#';
    std::cout << '\n';
  }
  std::cout << std::endl;
}